

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeSetDeltaGammaMax(void *arkode_mem,sunrealtype dgmax)

{
  ARKodeMem in_RDI;
  sunrealtype in_XMM0_Qa;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x265,"ARKodeSetDeltaGammaMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->step_supports_implicit == 0) {
    arkProcessError(in_RDI,-0x30,0x26e,"ARKodeSetDeltaGammaMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"time-stepping module does not require an algebraic solver");
    local_4 = -0x30;
  }
  else if (in_RDI->step_setdeltagammamax == (ARKTimestepSetDeltaGammaMax)0x0) {
    arkProcessError(in_RDI,-0x30,0x27a,"ARKodeSetDeltaGammaMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"time-stepping module does not support this function");
    local_4 = -0x30;
  }
  else {
    local_4 = (*in_RDI->step_setdeltagammamax)(in_RDI,in_XMM0_Qa);
  }
  return local_4;
}

Assistant:

int ARKodeSetDeltaGammaMax(void* arkode_mem, sunrealtype dgmax)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not need an algebraic solver */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not require an algebraic solver");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* Call stepper routine (if provided) */
  if (ark_mem->step_setdeltagammamax)
  {
    return (ark_mem->step_setdeltagammamax(arkode_mem, dgmax));
  }
  else
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__,
                    "time-stepping module does not support this function");
    return (ARK_STEPPER_UNSUPPORTED);
  }
}